

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protostream_objectwriter.cc
# Opt level: O1

Status * google::protobuf::util::converter::ProtoStreamObjectWriter::RenderDuration
                   (Status *__return_storage_ptr__,ProtoStreamObjectWriter *ow,DataPiece *data)

{
  string *psVar1;
  undefined **ppuVar2;
  StringPiece error_message;
  string *psVar3;
  uint64 uVar4;
  undefined1 error_message_00 [16];
  bool bVar5;
  StringPiece *pSVar6;
  size_type n;
  uint64 uVar7;
  AlphaNum *b;
  stringpiece_ssize_type sVar8;
  char *pcVar9;
  int iVar10;
  long lVar11;
  StringPiece s;
  StringPiece SVar12;
  StringPiece SVar13;
  StringPiece error_message_01;
  StringPiece error_message_02;
  StringPiece error_message_03;
  StringPiece local_130;
  StringPiece local_120;
  StringPiece local_110;
  string local_100;
  uint64 local_e0;
  uint64 unsigned_seconds;
  string local_d0;
  undefined1 local_b0 [16];
  anon_union_16_8_b72e7a25_for_DataPiece_3 local_a0;
  bool local_90;
  ProtoStreamObjectWriter *local_80;
  int local_74;
  undefined1 auStack_70 [8];
  Status nanos_status;
  uint local_34 [2];
  int32 i_nanos;
  
  if (data->type_ == TYPE_STRING) {
    local_100._0_16_ = DataPiece::str(data);
    pcVar9 = local_100._M_dataplus._M_p;
    psVar1 = &nanos_status.error_message_;
    auStack_70 = (undefined1  [8])psVar1;
    if (pcVar9 == (char *)0x0) {
      nanos_status.error_code_ = OK;
      nanos_status._4_4_ = 0;
      nanos_status.error_message_._M_dataplus._M_p._0_1_ = 0;
    }
    else {
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)auStack_70,pcVar9,pcVar9 + local_100._M_string_length);
    }
    local_b0._0_8_ = local_b0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"s","");
    psVar3 = (string *)CONCAT44(local_b0._12_4_,local_b0._8_4_);
    if ((ulong)nanos_status._0_8_ < psVar3) {
      bVar5 = false;
    }
    else {
      iVar10 = std::__cxx11::string::compare
                         ((ulong)auStack_70,nanos_status._0_8_ - (long)psVar3,psVar3);
      bVar5 = iVar10 == 0;
    }
    if ((undefined1 *)local_b0._0_8_ != local_b0 + 0x10) {
      operator_delete((void *)local_b0._0_8_);
    }
    if (auStack_70 != (undefined1  [8])psVar1) {
      operator_delete((void *)auStack_70);
    }
    if (bVar5) {
      local_100._0_16_ =
           StringPiece::substr((StringPiece *)&local_100,0,local_100._M_string_length - 1);
      local_74 = 1;
      if ((0 < local_100._M_string_length) && (*local_100._M_dataplus._M_p == '-')) {
        local_100._0_16_ = StringPiece::substr((StringPiece *)&local_100,1,0xffffffffffffffff);
        local_74 = -1;
      }
      auStack_70._0_4_ = local_100._M_dataplus._M_p._0_4_;
      auStack_70._4_4_ = local_100._M_dataplus._M_p._4_4_;
      nanos_status._0_8_ = local_100._M_string_length;
      local_80 = ow;
      n = StringPiece::rfind((StringPiece *)auStack_70,'.',0xffffffffffffffff);
      unsigned_seconds = 0xffffffffffffffff;
      if (n == 0xffffffffffffffff) {
        SVar12.ptr_._4_4_ = auStack_70._4_4_;
        SVar12.ptr_._0_4_ = auStack_70._0_4_;
        SVar12.length_ = nanos_status._0_8_;
        SVar13 = (StringPiece)ZEXT816(0);
      }
      else {
        SVar12 = StringPiece::substr((StringPiece *)auStack_70,0,n);
        SVar13 = StringPiece::substr((StringPiece *)auStack_70,n + 1,0xffffffffffffffff);
      }
      pcVar9 = SVar12.ptr_;
      auStack_70 = (undefined1  [8])&nanos_status.error_message_;
      if (pcVar9 == (char *)0x0) {
        nanos_status.error_code_ = OK;
        nanos_status._4_4_ = 0;
        nanos_status.error_message_._M_dataplus._M_p._0_1_ = 0;
      }
      else {
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)auStack_70,pcVar9,pcVar9 + SVar12.length_);
      }
      bVar5 = safe_strtou64((string *)auStack_70,&local_e0);
      if (auStack_70 != (undefined1  [8])&nanos_status.error_message_) {
        operator_delete((void *)auStack_70);
      }
      if (bVar5) {
        iVar10 = -2;
        local_d0._0_16_ = SVar13;
        do {
          SVar13.length_ = 1;
          SVar13.ptr_ = "0";
          bVar5 = StringPiece::Consume((StringPiece *)&local_d0,SVar13);
          uVar4 = unsigned_seconds;
          iVar10 = iVar10 + 1;
        } while (bVar5);
        local_34[0] = 0;
        ppuVar2 = (undefined **)(local_b0 + 0x10);
        if (local_d0._M_string_length == 0) {
LAB_0032888c:
          if (1000000000 < local_34[0]) {
            pcVar9 = "Duration value exceeds limits";
            sVar8 = 0x1d;
            goto LAB_0032890f;
          }
          s.length_ = 10;
          s.ptr_ = "0123456789";
          uVar7 = StringPiece::find_first_not_of((StringPiece *)&local_d0,s,0);
          if (uVar7 != uVar4) {
            error_message_03.length_ = 0x35;
            error_message_03.ptr_ = "Invalid duration format, failed to parse nano seconds";
            Status::Status((Status *)auStack_70,INVALID_ARGUMENT,error_message_03);
            goto LAB_00328938;
          }
          if ((int)local_34[0] < 1) {
            iVar10 = 0;
LAB_00328a70:
            Status::Status((Status *)auStack_70);
          }
          else {
            if ((uint)(iVar10 + (int)local_d0._M_string_length) < 9) {
              iVar10 = local_34[0] *
                       *(int *)(&DAT_00360f38 +
                               (ulong)(uint)(iVar10 + (int)local_d0._M_string_length) * 4);
              goto LAB_00328a70;
            }
            StringPiece::StringPiece((StringPiece *)local_b0,"Duration value exceeds limits");
            error_message.length_._0_4_ = local_b0._8_4_;
            error_message.ptr_ = (char *)local_b0._0_8_;
            error_message.length_._4_4_ = local_b0._12_4_;
            Status::Status((Status *)auStack_70,INVALID_ARGUMENT,error_message);
            iVar10 = 0;
          }
        }
        else {
          local_b0._0_8_ = ppuVar2;
          if (local_d0._M_dataplus._M_p == (char *)0x0) {
            local_b0._8_4_ = 0;
            local_b0._12_4_ = 0;
            local_a0.u64_ = local_a0.u64_ & 0xffffffffffffff00;
          }
          else {
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_b0,local_d0._M_dataplus._M_p,
                       local_d0._M_dataplus._M_p + local_d0._M_string_length);
          }
          bVar5 = safe_strto32((string *)local_b0,(int32 *)local_34);
          if ((undefined **)local_b0._0_8_ != ppuVar2) {
            operator_delete((void *)local_b0._0_8_);
          }
          if (bVar5) goto LAB_0032888c;
          pcVar9 = "Invalid duration format, failed to parse nano seconds";
          sVar8 = 0x35;
LAB_0032890f:
          error_message_02.length_ = sVar8;
          error_message_02.ptr_ = pcVar9;
          Status::Status((Status *)auStack_70,INVALID_ARGUMENT,error_message_02);
LAB_00328938:
          iVar10 = 0;
        }
        if (auStack_70._0_4_ == OK) {
          lVar11 = (long)local_74;
          if ((lVar11 * local_e0 - 0x4979cb9e01 < 0xffffff6d0c68c3ff) ||
             (iVar10 = iVar10 * local_74, iVar10 + 0xc4653600U < 0x88ca6c01)) {
            StringPiece::StringPiece(&local_130,"Duration value exceeds limits");
            Status::Status(__return_storage_ptr__,INVALID_ARGUMENT,local_130);
          }
          else {
            StringPiece::StringPiece(&local_120,"seconds");
            local_b0._0_8_ = &PTR__DataPiece_003c8cd8;
            local_b0._8_4_ = TYPE_INT64;
            local_90 = false;
            local_a0.i64_ = lVar11 * local_e0;
            ProtoWriter::RenderDataPiece
                      (&local_80->super_ProtoWriter,local_120,(DataPiece *)local_b0);
            StringPiece::StringPiece(&local_110,"nanos");
            local_b0._0_8_ = &PTR__DataPiece_003c8cd8;
            local_b0._8_4_ = TYPE_INT32;
            local_a0.i32_ = iVar10;
            local_90 = false;
            ProtoWriter::RenderDataPiece
                      (&local_80->super_ProtoWriter,local_110,(DataPiece *)local_b0);
            Status::Status(__return_storage_ptr__);
          }
        }
        else {
          Status::Status(__return_storage_ptr__,(Status *)auStack_70);
        }
        pSVar6 = (StringPiece *)&nanos_status.error_message_._M_string_length;
        goto LAB_003285d1;
      }
      pcVar9 = "Invalid duration format, failed to parse seconds";
      sVar8 = 0x30;
    }
    else {
      pcVar9 = "Illegal duration format; duration must end with \'s\'";
      sVar8 = 0x33;
    }
    error_message_01.length_ = sVar8;
    error_message_01.ptr_ = pcVar9;
    Status::Status(__return_storage_ptr__,INVALID_ARGUMENT,error_message_01);
  }
  else {
    if (data->type_ == TYPE_NULL) {
      Status::Status(__return_storage_ptr__);
      return __return_storage_ptr__;
    }
    auStack_70._0_4_ = 0x36121c;
    auStack_70._4_4_ = 0;
    nanos_status.error_code_ = 0x29;
    nanos_status._4_4_ = 0;
    b = (AlphaNum *)0x0;
    DataPiece::ValueAsStringOrDefault_abi_cxx11_(&local_100,data,(StringPiece)ZEXT816(0x352cac));
    local_b0._0_8_ = local_100._M_dataplus._M_p;
    local_b0._8_4_ = (undefined4)local_100._M_string_length;
    local_b0._12_4_ = local_100._M_string_length._4_4_;
    StrCat_abi_cxx11_(&local_d0,(protobuf *)auStack_70,(AlphaNum *)local_b0,b);
    error_message_00 = (undefined1  [16])local_d0._0_16_;
    if ((long)local_d0._M_string_length < 0) {
      StringPiece::LogFatalSizeTooBig(local_d0._M_string_length,"size_t to int conversion");
    }
    Status::Status(__return_storage_ptr__,INVALID_ARGUMENT,(StringPiece)error_message_00);
    if ((StringPiece *)local_d0._M_dataplus._M_p != (StringPiece *)&local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    pSVar6 = (StringPiece *)&local_100.field_2;
LAB_003285d1:
    if ((StringPiece *)pSVar6[-1].ptr_ != pSVar6) {
      operator_delete((StringPiece *)pSVar6[-1].ptr_);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Status ProtoStreamObjectWriter::RenderDuration(ProtoStreamObjectWriter* ow,
                                               const DataPiece& data) {
  if (data.type() == DataPiece::TYPE_NULL) return Status();
  if (data.type() != DataPiece::TYPE_STRING) {
    return Status(util::error::INVALID_ARGUMENT,
                  StrCat("Invalid data type for duration, value is ",
                               data.ValueAsStringOrDefault("")));
  }

  StringPiece value(data.str());

  if (!HasSuffixString(value, "s")) {
    return Status(util::error::INVALID_ARGUMENT,
                  "Illegal duration format; duration must end with 's'");
  }
  value = value.substr(0, value.size() - 1);
  int sign = 1;
  if (HasPrefixString(value, "-")) {
    sign = -1;
    value = value.substr(1);
  }

  StringPiece s_secs, s_nanos;
  SplitSecondsAndNanos(value, &s_secs, &s_nanos);
  uint64 unsigned_seconds;
  if (!safe_strtou64(s_secs, &unsigned_seconds)) {
    return Status(util::error::INVALID_ARGUMENT,
                  "Invalid duration format, failed to parse seconds");
  }

  int32 nanos = 0;
  Status nanos_status = GetNanosFromStringPiece(
      s_nanos, "Invalid duration format, failed to parse nano seconds",
      "Duration value exceeds limits", &nanos);
  if (!nanos_status.ok()) {
    return nanos_status;
  }
  nanos = sign * nanos;

  int64 seconds = sign * unsigned_seconds;
  if (seconds > kDurationMaxSeconds || seconds < kDurationMinSeconds ||
      nanos <= -kNanosPerSecond || nanos >= kNanosPerSecond) {
    return Status(util::error::INVALID_ARGUMENT,
                  "Duration value exceeds limits");
  }

  ow->ProtoWriter::RenderDataPiece("seconds", DataPiece(seconds));
  ow->ProtoWriter::RenderDataPiece("nanos", DataPiece(nanos));
  return Status();
}